

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
               *this,raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                     *that,allocator_type *a)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  slot_type *psVar4;
  proxy *ppVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [11];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  int iVar23;
  undefined4 extraout_var;
  uint uVar25;
  value_type *v;
  slot_type *psVar26;
  size_t hashval;
  char *pcVar27;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  FindInfo FVar28;
  ulong uVar24;
  
  this->ctrl_ = EmptyGroup()::empty_group;
  (this->settings_).
  super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>,_0UL,_false>
  .value = 0;
  this->slots_ = (slot_type *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  rehash(this,that->capacity_);
  pcVar2 = that->ctrl_;
  psVar26 = that->slots_;
  cVar1 = *pcVar2;
  pcVar27 = pcVar2;
  while (cVar1 < -1) {
    iVar23 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                    CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar12 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                    CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar13 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                    CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar14 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                    CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*pcVar27 < (char)iVar23);
    in_XMM1_Bb = -(pcVar27[1] < (char)((uint)iVar23 >> 8));
    in_XMM1_Bc = -(pcVar27[2] < (char)((uint)iVar23 >> 0x10));
    in_XMM1_Bd = -(pcVar27[3] < (char)((uint)iVar23 >> 0x18));
    in_XMM1_Be = -(pcVar27[4] < (char)iVar12);
    in_XMM1_Bf = -(pcVar27[5] < (char)((uint)iVar12 >> 8));
    in_XMM1_Bg = -(pcVar27[6] < (char)((uint)iVar12 >> 0x10));
    in_XMM1_Bh = -(pcVar27[7] < (char)((uint)iVar12 >> 0x18));
    in_XMM1_Bi = -(pcVar27[8] < (char)iVar13);
    in_XMM1_Bj = -(pcVar27[9] < (char)((uint)iVar13 >> 8));
    in_XMM1_Bk = -(pcVar27[10] < (char)((uint)iVar13 >> 0x10));
    in_XMM1_Bl = -(pcVar27[0xb] < (char)((uint)iVar13 >> 0x18));
    in_XMM1_Bm = -(pcVar27[0xc] < (char)iVar14);
    in_XMM1_Bn = -(pcVar27[0xd] < (char)((uint)iVar14 >> 8));
    in_XMM1_Bo = -(pcVar27[0xe] < (char)((uint)iVar14 >> 0x10));
    in_XMM1_Bp = -(pcVar27[0xf] < (char)((uint)iVar14 >> 0x18));
    auVar8[1] = in_XMM1_Bb;
    auVar8[0] = in_XMM1_Ba;
    auVar8[2] = in_XMM1_Bc;
    auVar8[3] = in_XMM1_Bd;
    auVar8[4] = in_XMM1_Be;
    auVar8[5] = in_XMM1_Bf;
    auVar8[6] = in_XMM1_Bg;
    auVar8[7] = in_XMM1_Bh;
    auVar8[8] = in_XMM1_Bi;
    auVar8[9] = in_XMM1_Bj;
    auVar8[10] = in_XMM1_Bk;
    auVar8[0xb] = in_XMM1_Bl;
    auVar8[0xc] = in_XMM1_Bm;
    auVar8[0xd] = in_XMM1_Bn;
    auVar8[0xe] = in_XMM1_Bo;
    auVar8[0xf] = in_XMM1_Bp;
    auVar9[1] = in_XMM1_Bb;
    auVar9[0] = in_XMM1_Ba;
    auVar9[2] = in_XMM1_Bc;
    auVar9[3] = in_XMM1_Bd;
    auVar9[4] = in_XMM1_Be;
    auVar9[5] = in_XMM1_Bf;
    auVar9[6] = in_XMM1_Bg;
    auVar9[7] = in_XMM1_Bh;
    auVar9[8] = in_XMM1_Bi;
    auVar9[9] = in_XMM1_Bj;
    auVar9[10] = in_XMM1_Bk;
    auVar9[0xb] = in_XMM1_Bl;
    auVar9[0xc] = in_XMM1_Bm;
    auVar9[0xd] = in_XMM1_Bn;
    auVar9[0xe] = in_XMM1_Bo;
    auVar9[0xf] = in_XMM1_Bp;
    auVar21[1] = in_XMM1_Bd;
    auVar21[0] = in_XMM1_Bc;
    auVar21[2] = in_XMM1_Be;
    auVar21[3] = in_XMM1_Bf;
    auVar21[4] = in_XMM1_Bg;
    auVar21[5] = in_XMM1_Bh;
    auVar21[6] = in_XMM1_Bi;
    auVar21[7] = in_XMM1_Bj;
    auVar21[8] = in_XMM1_Bk;
    auVar21[9] = in_XMM1_Bl;
    auVar21[10] = in_XMM1_Bm;
    auVar21[0xb] = in_XMM1_Bn;
    auVar21[0xc] = in_XMM1_Bo;
    auVar21[0xd] = in_XMM1_Bp;
    auVar19[1] = in_XMM1_Be;
    auVar19[0] = in_XMM1_Bd;
    auVar19[2] = in_XMM1_Bf;
    auVar19[3] = in_XMM1_Bg;
    auVar19[4] = in_XMM1_Bh;
    auVar19[5] = in_XMM1_Bi;
    auVar19[6] = in_XMM1_Bj;
    auVar19[7] = in_XMM1_Bk;
    auVar19[8] = in_XMM1_Bl;
    auVar19[9] = in_XMM1_Bm;
    auVar19[10] = in_XMM1_Bn;
    auVar19[0xb] = in_XMM1_Bo;
    auVar19[0xc] = in_XMM1_Bp;
    auVar17[1] = in_XMM1_Bf;
    auVar17[0] = in_XMM1_Be;
    auVar17[2] = in_XMM1_Bg;
    auVar17[3] = in_XMM1_Bh;
    auVar17[4] = in_XMM1_Bi;
    auVar17[5] = in_XMM1_Bj;
    auVar17[6] = in_XMM1_Bk;
    auVar17[7] = in_XMM1_Bl;
    auVar17[8] = in_XMM1_Bm;
    auVar17[9] = in_XMM1_Bn;
    auVar17[10] = in_XMM1_Bo;
    auVar17[0xb] = in_XMM1_Bp;
    auVar15[1] = in_XMM1_Bg;
    auVar15[0] = in_XMM1_Bf;
    auVar15[2] = in_XMM1_Bh;
    auVar15[3] = in_XMM1_Bi;
    auVar15[4] = in_XMM1_Bj;
    auVar15[5] = in_XMM1_Bk;
    auVar15[6] = in_XMM1_Bl;
    auVar15[7] = in_XMM1_Bm;
    auVar15[8] = in_XMM1_Bn;
    auVar15[9] = in_XMM1_Bo;
    auVar15[10] = in_XMM1_Bp;
    uVar25 = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar21 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar19 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar17 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar15 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                               CONCAT18(in_XMM1_Bo,
                                                        CONCAT17(in_XMM1_Bn,
                                                                 CONCAT16(in_XMM1_Bm,
                                                                          CONCAT15(in_XMM1_Bl,
                                                                                   CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                               CONCAT17(in_XMM1_Bo,
                                                        CONCAT16(in_XMM1_Bn,
                                                                 CONCAT15(in_XMM1_Bm,
                                                                          CONCAT14(in_XMM1_Bl,
                                                                                   CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
    uVar6 = 0;
    if (uVar25 != 0) {
      for (; (uVar25 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
      }
    }
    psVar26 = psVar26 + uVar6;
    cVar1 = pcVar27[uVar6];
    pcVar27 = pcVar27 + uVar6;
  }
  sVar3 = that->capacity_;
  if (pcVar27 != pcVar2 + sVar3) {
    do {
      if (psVar26->mDat == (proxy *)0x0) {
        uVar24 = 0;
      }
      else {
        iVar23 = (*psVar26->mDat->data->_vptr_baseHolder[7])();
        uVar24 = CONCAT44(extraout_var,iVar23);
      }
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar24;
      hashval = SUB168(auVar7 * ZEXT816(0xde5fb9d2630458e9),8) +
                SUB168(auVar7 * ZEXT816(0xde5fb9d2630458e9),0);
      FVar28 = find_first_non_full(this,hashval);
      set_ctrl(this,FVar28.offset,(byte)hashval & 0x7f);
      psVar4 = this->slots_;
      ppVar5 = psVar26->mDat;
      if (ppVar5 != (proxy *)0x0) {
        ppVar5->refcount = ppVar5->refcount + 1;
      }
      psVar4[FVar28.offset].mDat = ppVar5;
      psVar26 = psVar26 + 1;
      cVar1 = pcVar27[1];
      pcVar27 = pcVar27 + 1;
      while (cVar1 < -1) {
        iVar23 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        == CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        );
        iVar12 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        == CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        );
        iVar13 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        == CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        );
        iVar14 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar27 < (char)iVar23);
        in_XMM1_Bb = -(pcVar27[1] < (char)((uint)iVar23 >> 8));
        in_XMM1_Bc = -(pcVar27[2] < (char)((uint)iVar23 >> 0x10));
        in_XMM1_Bd = -(pcVar27[3] < (char)((uint)iVar23 >> 0x18));
        in_XMM1_Be = -(pcVar27[4] < (char)iVar12);
        in_XMM1_Bf = -(pcVar27[5] < (char)((uint)iVar12 >> 8));
        in_XMM1_Bg = -(pcVar27[6] < (char)((uint)iVar12 >> 0x10));
        in_XMM1_Bh = -(pcVar27[7] < (char)((uint)iVar12 >> 0x18));
        in_XMM1_Bi = -(pcVar27[8] < (char)iVar13);
        in_XMM1_Bj = -(pcVar27[9] < (char)((uint)iVar13 >> 8));
        in_XMM1_Bk = -(pcVar27[10] < (char)((uint)iVar13 >> 0x10));
        in_XMM1_Bl = -(pcVar27[0xb] < (char)((uint)iVar13 >> 0x18));
        in_XMM1_Bm = -(pcVar27[0xc] < (char)iVar14);
        in_XMM1_Bn = -(pcVar27[0xd] < (char)((uint)iVar14 >> 8));
        in_XMM1_Bo = -(pcVar27[0xe] < (char)((uint)iVar14 >> 0x10));
        in_XMM1_Bp = -(pcVar27[0xf] < (char)((uint)iVar14 >> 0x18));
        auVar10[1] = in_XMM1_Bb;
        auVar10[0] = in_XMM1_Ba;
        auVar10[2] = in_XMM1_Bc;
        auVar10[3] = in_XMM1_Bd;
        auVar10[4] = in_XMM1_Be;
        auVar10[5] = in_XMM1_Bf;
        auVar10[6] = in_XMM1_Bg;
        auVar10[7] = in_XMM1_Bh;
        auVar10[8] = in_XMM1_Bi;
        auVar10[9] = in_XMM1_Bj;
        auVar10[10] = in_XMM1_Bk;
        auVar10[0xb] = in_XMM1_Bl;
        auVar10[0xc] = in_XMM1_Bm;
        auVar10[0xd] = in_XMM1_Bn;
        auVar10[0xe] = in_XMM1_Bo;
        auVar10[0xf] = in_XMM1_Bp;
        auVar11[1] = in_XMM1_Bb;
        auVar11[0] = in_XMM1_Ba;
        auVar11[2] = in_XMM1_Bc;
        auVar11[3] = in_XMM1_Bd;
        auVar11[4] = in_XMM1_Be;
        auVar11[5] = in_XMM1_Bf;
        auVar11[6] = in_XMM1_Bg;
        auVar11[7] = in_XMM1_Bh;
        auVar11[8] = in_XMM1_Bi;
        auVar11[9] = in_XMM1_Bj;
        auVar11[10] = in_XMM1_Bk;
        auVar11[0xb] = in_XMM1_Bl;
        auVar11[0xc] = in_XMM1_Bm;
        auVar11[0xd] = in_XMM1_Bn;
        auVar11[0xe] = in_XMM1_Bo;
        auVar11[0xf] = in_XMM1_Bp;
        auVar22[1] = in_XMM1_Bd;
        auVar22[0] = in_XMM1_Bc;
        auVar22[2] = in_XMM1_Be;
        auVar22[3] = in_XMM1_Bf;
        auVar22[4] = in_XMM1_Bg;
        auVar22[5] = in_XMM1_Bh;
        auVar22[6] = in_XMM1_Bi;
        auVar22[7] = in_XMM1_Bj;
        auVar22[8] = in_XMM1_Bk;
        auVar22[9] = in_XMM1_Bl;
        auVar22[10] = in_XMM1_Bm;
        auVar22[0xb] = in_XMM1_Bn;
        auVar22[0xc] = in_XMM1_Bo;
        auVar22[0xd] = in_XMM1_Bp;
        auVar20[1] = in_XMM1_Be;
        auVar20[0] = in_XMM1_Bd;
        auVar20[2] = in_XMM1_Bf;
        auVar20[3] = in_XMM1_Bg;
        auVar20[4] = in_XMM1_Bh;
        auVar20[5] = in_XMM1_Bi;
        auVar20[6] = in_XMM1_Bj;
        auVar20[7] = in_XMM1_Bk;
        auVar20[8] = in_XMM1_Bl;
        auVar20[9] = in_XMM1_Bm;
        auVar20[10] = in_XMM1_Bn;
        auVar20[0xb] = in_XMM1_Bo;
        auVar20[0xc] = in_XMM1_Bp;
        auVar18[1] = in_XMM1_Bf;
        auVar18[0] = in_XMM1_Be;
        auVar18[2] = in_XMM1_Bg;
        auVar18[3] = in_XMM1_Bh;
        auVar18[4] = in_XMM1_Bi;
        auVar18[5] = in_XMM1_Bj;
        auVar18[6] = in_XMM1_Bk;
        auVar18[7] = in_XMM1_Bl;
        auVar18[8] = in_XMM1_Bm;
        auVar18[9] = in_XMM1_Bn;
        auVar18[10] = in_XMM1_Bo;
        auVar18[0xb] = in_XMM1_Bp;
        auVar16[1] = in_XMM1_Bg;
        auVar16[0] = in_XMM1_Bf;
        auVar16[2] = in_XMM1_Bh;
        auVar16[3] = in_XMM1_Bi;
        auVar16[4] = in_XMM1_Bj;
        auVar16[5] = in_XMM1_Bk;
        auVar16[6] = in_XMM1_Bl;
        auVar16[7] = in_XMM1_Bm;
        auVar16[8] = in_XMM1_Bn;
        auVar16[9] = in_XMM1_Bo;
        auVar16[10] = in_XMM1_Bp;
        uVar25 = (ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar22 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar20 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar18 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar16 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar6 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        psVar26 = psVar26 + uVar6;
        cVar1 = pcVar27[uVar6];
        pcVar27 = pcVar27 + uVar6;
      }
    } while (pcVar27 != pcVar2 + sVar3);
  }
  this->size_ = that->size_;
  (this->settings_).
  super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>,_0UL,_false>
  .value = (this->settings_).
           super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
           .
           super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>,_0UL,_false>
           .value - that->size_;
  return;
}

Assistant:

raw_hash_set(const raw_hash_set& that, const allocator_type& a)
				: raw_hash_set(0, that.hash_ref(), that.eq_ref(), a)
			{
				rehash(that.capacity());   // operator=() should preserve load_factor
				// Because the table is guaranteed to be empty, we can do something faster
				// than a full `insert`.
				for (const auto& v : that) {
					const size_t hashval = PolicyTraits::apply(HashElement{hash_ref()}, v);
					auto target = find_first_non_full(hashval);
					set_ctrl(target.offset, H2(hashval));
					emplace_at(target.offset, v);
					infoz_.RecordInsert(hashval, target.probe_length);
				}
				size_ = that.size();
				growth_left() -= that.size();
			}